

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

double ON_MatrixSolutionPrecision
                 (uint N,double **M,bool bTransposeM,double lambda,double *X,double *B)

{
  double dVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if ((int)CONCAT71(in_register_00000011,bTransposeM) == 0) {
    if (N != 0) {
      uVar2 = 0;
      dVar8 = 0.0;
      do {
        dVar6 = -X[uVar2] * lambda;
        pdVar4 = M[uVar2];
        pdVar5 = X;
        do {
          dVar7 = *pdVar4;
          dVar1 = *pdVar5;
          pdVar4 = pdVar4 + 1;
          pdVar5 = pdVar5 + 1;
          dVar6 = dVar6 + dVar7 * dVar1;
        } while (pdVar5 < X + N);
        dVar7 = ABS(dVar6 - B[uVar2]);
        if (ABS(dVar6 - B[uVar2]) <= dVar8) {
          dVar7 = dVar8;
        }
        uVar2 = uVar2 + 1;
        dVar8 = dVar7;
      } while (uVar2 != N);
      return dVar7;
    }
  }
  else if (N != 0) {
    uVar2 = 0;
    dVar8 = 0.0;
    do {
      dVar6 = -X[uVar2] * lambda;
      uVar3 = 0;
      do {
        dVar6 = dVar6 + M[uVar3][uVar2] * X[uVar3];
        uVar3 = uVar3 + 1;
      } while (N != uVar3);
      dVar7 = ABS(dVar6 - B[uVar2]);
      if (ABS(dVar6 - B[uVar2]) <= dVar8) {
        dVar7 = dVar8;
      }
      uVar2 = uVar2 + 1;
      dVar8 = dVar7;
    } while (uVar2 != N);
    return dVar7;
  }
  return 0.0;
}

Assistant:

double ON_MatrixSolutionPrecision(
  const unsigned int N,
  const double*const* M,
  bool bTransposeM,
  double lambda,
  const double* X,
  const double* B
  )
{
  double delta = 0.0;
  if (bTransposeM)
  {
    for (unsigned int i = 0; i < N; i++)
    {
      const double* e = X;
      double Mei = -(lambda*e[i]);
      for ( unsigned int j = 0; j < N; j++ )
        Mei += M[j][i]*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }
  else
  {
    const double* e0 = X + N;
    for (unsigned int i = 0; i < N; i++)
    {
      const double* Mi = M[i];
      const double* e = X;
      double Mei = -(lambda*e[i]);
      while (e < e0)
        Mei += (*Mi++)*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }

  return delta;
}